

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_skip_bytes_straddle(mpack_reader_t *reader,size_t count)

{
  size_t sVar1;
  char *pcVar2;
  char *min_bytes;
  
  if (reader->fill == (mpack_reader_fill_t)0x0) {
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_invalid;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_invalid);
        return;
      }
    }
    return;
  }
  min_bytes = reader->data + (count - (long)reader->end);
  reader->data = reader->end;
  if (reader->skip != (mpack_reader_skip_t)0x0) {
    if ((char *)(reader->size >> 4) < min_bytes) {
      (*reader->skip)(reader,(size_t)min_bytes);
      return;
    }
    mpack_reader_skip_using_fill(reader,(size_t)min_bytes);
    return;
  }
  pcVar2 = (char *)reader->size;
  if (pcVar2 < min_bytes) {
    do {
      sVar1 = mpack_fill_range(reader,reader->buffer,(size_t)pcVar2,(size_t)pcVar2);
      if (sVar1 < reader->size) goto LAB_0010a7e7;
      min_bytes = min_bytes + -reader->size;
      pcVar2 = (char *)reader->size;
    } while (pcVar2 < min_bytes);
  }
  reader->data = reader->buffer;
  pcVar2 = (char *)mpack_fill_range(reader,reader->buffer,(size_t)min_bytes,(size_t)pcVar2);
  if (pcVar2 < min_bytes) {
LAB_0010a7e7:
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_io;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_io);
        return;
      }
    }
  }
  else {
    reader->end = reader->data + (long)pcVar2;
    reader->data = reader->data + (long)min_bytes;
  }
  return;
}

Assistant:

MPACK_NOINLINE static void mpack_skip_bytes_straddle(mpack_reader_t* reader, size_t count) {

    // we'll need at least a fill function to skip more data. if there's
    // no fill function, the buffer should contain an entire MessagePack
    // object, so we raise mpack_error_invalid instead of mpack_error_io
    // on truncated data. (see mpack_read_native_straddle())
    if (reader->fill == NULL) {
        mpack_log("reader has no fill function!\n");
        mpack_reader_flag_error(reader, mpack_error_invalid);
        return;
    }

    // discard whatever's left in the buffer
    size_t left = (size_t)(reader->end - reader->data);
    mpack_log("discarding %i bytes still in buffer\n", (int)left);
    count -= left;
    reader->data = reader->end;

    // use the skip function if we've got one, and if we're trying
    // to skip a lot of data. if we only need to skip some tiny
    // fraction of the buffer size, it's probably better to just
    // fill the buffer and skip from it instead of trying to seek.
    if (reader->skip && count > reader->size / 16) {
        mpack_log("calling skip function for %i bytes\n", (int)count);
        reader->skip(reader, count);
        return;
    }

    mpack_reader_skip_using_fill(reader, count);
}